

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O0

int main_internal(int argc,char **argv)

{
  bool bVar1;
  char *pcVar2;
  undefined4 in_register_0000003c;
  undefined1 local_100 [8];
  crunch converter;
  corpus_tester tester;
  corpus_gen generator;
  bool status;
  undefined1 local_28 [8];
  dynamic_string cmd_line;
  char **argv_local;
  int argc_local;
  
  cmd_line.m_pStr = (char *)argv;
  crnlib::colorized_console::init((EVP_PKEY_CTX *)CONCAT44(in_register_0000003c,argc));
  bVar1 = check_for_option(argc,(char **)cmd_line.m_pStr,"quiet");
  if (bVar1) {
    crnlib::console::disable_output();
  }
  print_title();
  bVar1 = check_for_option(argc,(char **)cmd_line.m_pStr,"version");
  if (bVar1) {
    argv_local._4_4_ = 0;
  }
  else {
    bVar1 = check_for_option(argc,(char **)cmd_line.m_pStr,"help");
    if (bVar1) {
      crunch::print_usage();
      argv_local._4_4_ = 0;
    }
    else {
      crnlib::dynamic_string::dynamic_string((dynamic_string *)local_28);
      crnlib::get_command_line_as_single_string
                ((dynamic_string *)local_28,argc,(char **)cmd_line.m_pStr);
      tester.m_next_bad_block_index._3_1_ = 0;
      bVar1 = check_for_option(argc,(char **)cmd_line.m_pStr,"corpus_gen");
      if (bVar1) {
        crn::corpus_gen::corpus_gen((corpus_gen *)((long)&tester.m_next_bad_block_index + 2));
        pcVar2 = crnlib::dynamic_string::get_ptr((dynamic_string *)local_28);
        tester.m_next_bad_block_index._3_1_ =
             crn::corpus_gen::generate
                       ((corpus_gen *)((long)&tester.m_next_bad_block_index + 2),pcVar2);
      }
      else {
        bVar1 = check_for_option(argc,(char **)cmd_line.m_pStr,"corpus_test");
        if (bVar1) {
          crn::corpus_tester::corpus_tester
                    ((corpus_tester *)
                     &converter.m_params.m_param_map._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count);
          pcVar2 = crnlib::dynamic_string::get_ptr((dynamic_string *)local_28);
          tester.m_next_bad_block_index._3_1_ =
               crn::corpus_tester::test
                         ((corpus_tester *)
                          &converter.m_params.m_param_map._M_t._M_impl.super__Rb_tree_header.
                           _M_node_count,pcVar2);
          crn::corpus_tester::~corpus_tester
                    ((corpus_tester *)
                     &converter.m_params.m_param_map._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count);
        }
        else {
          crunch::crunch((crunch *)local_100);
          pcVar2 = crnlib::dynamic_string::get_ptr((dynamic_string *)local_28);
          tester.m_next_bad_block_index._3_1_ = crunch::convert((crunch *)local_100,pcVar2);
          crunch::~crunch((crunch *)local_100);
        }
      }
      crnlib::colorized_console::deinit();
      crnlib::crnlib_print_mem_stats();
      argv_local._4_4_ = (uint)((tester.m_next_bad_block_index._3_1_ & 1) == 0);
      crnlib::dynamic_string::~dynamic_string((dynamic_string *)local_28);
    }
  }
  return argv_local._4_4_;
}

Assistant:

static int main_internal(int argc, char* argv[])
{
    argc;
    argv;

    colorized_console::init();

    if (check_for_option(argc, argv, "quiet"))
    {
        console::disable_output();
    }

    print_title();

    if (check_for_option(argc, argv, "version"))
    {
        return EXIT_SUCCESS;
    }

    if (check_for_option(argc, argv, "help"))
    {
        crunch::print_usage();
        return EXIT_SUCCESS;
    }

    dynamic_string cmd_line;
    get_command_line_as_single_string(cmd_line, argc, argv);

    bool status = false;
    if (check_for_option(argc, argv, "corpus_gen"))
    {
        corpus_gen generator;
        status = generator.generate(cmd_line.get_ptr());
    }
    else if (check_for_option(argc, argv, "corpus_test"))
    {
        corpus_tester tester;
        status = tester.test(cmd_line.get_ptr());
    }
    else
    {
        crunch converter;
        status = converter.convert(cmd_line.get_ptr());
    }

    colorized_console::deinit();

    crnlib_print_mem_stats();

    return status ? EXIT_SUCCESS : EXIT_FAILURE;
}